

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

MemberIterator __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *name)

{
  bool bVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RAX;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *in_RDX;
  undefined8 local_28;
  
  if (name->flags_ != 3) {
    __assert_fail("IsObject()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/document.h"
                  ,0x3ad,
                  "MemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::FindMember(const GenericValue<Encoding, SourceAllocator> &) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>, SourceAllocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  if (((byte)in_RDX[0x12] & 0x10) != 0) {
    local_28 = in_RAX;
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    MemberBegin((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)this);
    while( true ) {
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&stack0xffffffffffffffd8);
      if (*(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            **)this ==
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           *)local_28) {
        return (MemberIterator)(Pointer)this;
      }
      bVar1 = StringEqual<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        (in_RDX,*(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                  **)this);
      if (bVar1) break;
      *(long *)this = *(long *)this + 0x30;
    }
    return (MemberIterator)(Pointer)this;
  }
  __assert_fail("name.IsString()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/document.h"
                ,0x3ae,
                "MemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::FindMember(const GenericValue<Encoding, SourceAllocator> &) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>, SourceAllocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool IsObject() const { return flags_ == kObjectFlag; }